

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void __thiscall
pbrt::AliasTable::AliasTable(AliasTable *this,span<const_float> weights,Allocator alloc)

{
  Bin **ppBVar1;
  float fVar2;
  float fVar3;
  Bin *pBVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Float *pFVar8;
  ulong uVar9;
  pointer pOVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  pointer pOVar15;
  undefined1 auVar16 [64];
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  int vb;
  undefined1 auStack_74 [12];
  pointer local_68;
  Float va;
  undefined1 auStack_54 [12];
  pointer pOStack_50;
  pointer local_48;
  value_type local_40;
  
  sVar13 = weights.n;
  (this->bins).alloc.memoryResource = alloc.memoryResource;
  ppBVar1 = &(this->bins).ptr;
  (this->bins).ptr = (Bin *)0x0;
  (this->bins).nAlloc = 0;
  (this->bins).nStored = 0;
  pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
  reserve(&this->bins,sVar13);
  if (sVar13 != 0) {
    memset(*ppBVar1,0,sVar13 * 0xc);
  }
  (this->bins).nStored = sVar13;
  va = 0.0;
  if (sVar13 != 0) {
    auVar16 = ZEXT464(0) << 0x40;
    lVar11 = 0;
    do {
      dVar5 = auVar16._0_8_ + (double)*(float *)((long)weights.ptr + lVar11);
      auVar16 = ZEXT864((ulong)dVar5);
      lVar11 = lVar11 + 4;
    } while (sVar13 * 4 - lVar11 != 0);
    va = (Float)dVar5;
  }
  auVar6._12_4_ = 0;
  auVar6._0_12_ = auStack_74;
  _vb = auVar6 << 0x20;
  if (va <= 0.0) {
    LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],float&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x234,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"sum",
               (char (*) [2])0x2cbcd0a,(char (*) [4])"sum",&va,(char (*) [2])0x2cbcd0a,&vb);
  }
  if (sVar13 != 0) {
    pFVar8 = &(*ppBVar1)->pdf;
    sVar12 = 0;
    do {
      *pFVar8 = weights.ptr[sVar12] / va;
      sVar12 = sVar12 + 1;
      pFVar8 = pFVar8 + 3;
    } while (sVar13 != sVar12);
  }
  _vb = ZEXT816(0) << 0x20;
  local_48 = (pointer)0x0;
  local_68 = (pointer)0x0;
  uVar9 = (this->bins).nStored;
  _va = _vb;
  if (uVar9 != 0) {
    lVar11 = 4;
    uVar14 = 0;
    do {
      auVar7._8_8_ = in_XMM3_Qb;
      auVar7._0_8_ = in_XMM3_Qa;
      auVar6 = vcvtusi2ss_avx512f(auVar7,uVar9);
      local_40.pHat = auVar6._0_4_ * *(float *)((long)&(*ppBVar1)->q + lVar11);
      local_40.index = uVar14;
      if (1.0 <= local_40.pHat) {
        std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                  ((vector<Outcome,_std::allocator<Outcome>_> *)&vb,&local_40);
      }
      else {
        std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                  ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_40);
      }
      uVar14 = uVar14 + 1;
      uVar9 = (this->bins).nStored;
      lVar11 = lVar11 + 0xc;
    } while (uVar14 < uVar9);
  }
  pOVar15 = _va;
  if ((_va != pOStack_50) && (_vb != (pointer)auStack_74._4_8_)) {
    do {
      fVar2 = pOStack_50[-1].pHat;
      sVar13 = pOStack_50[-1].index;
      local_40.index = ((pointer)(auStack_74._4_8_ + -0x10))->index;
      fVar3 = ((pointer)(auStack_74._4_8_ + -0x10))->pHat;
      pOStack_50 = pOStack_50 + -1;
      auStack_74._4_8_ = (pointer)(auStack_74._4_8_ + -0x10);
      pBVar4 = *ppBVar1;
      pBVar4[sVar13].q = fVar2;
      pBVar4[sVar13].alias = (int)local_40.index;
      local_40.pHat = fVar2 + fVar3 + -1.0;
      if (1.0 <= local_40.pHat) {
        std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                  ((vector<Outcome,_std::allocator<Outcome>_> *)&vb,&local_40);
      }
      else {
        std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                  ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_40);
      }
      pOVar15 = _va;
    } while ((_va != pOStack_50) && (_vb != (pointer)auStack_74._4_8_));
  }
  if (_vb != (pointer)auStack_74._4_8_) {
    pBVar4 = *ppBVar1;
    do {
      sVar13 = ((pointer)(auStack_74._4_8_ + -0x10))->index;
      auStack_74._4_8_ = auStack_74._4_8_ + -0x10;
      pBVar4[sVar13].q = 1.0;
      pBVar4[sVar13].alias = -1;
    } while ((pointer)auStack_74._4_8_ != _vb);
  }
  if (pOVar15 != pOStack_50) {
    pBVar4 = *ppBVar1;
    pOVar10 = pOStack_50;
    do {
      sVar13 = pOVar10[-1].index;
      pOVar10 = pOVar10 + -1;
      pBVar4[sVar13].q = 1.0;
      pBVar4[sVar13].alias = -1;
    } while (pOVar10 != pOVar15);
    pOStack_50 = pOVar10;
  }
  if (_vb != (pointer)0x0) {
    operator_delete(_vb,(long)local_68 - (long)_vb);
  }
  if (pOVar15 != (pointer)0x0) {
    operator_delete(pOVar15,(long)local_48 - (long)pOVar15);
    return;
  }
  return;
}

Assistant:

AliasTable::AliasTable(pstd::span<const Float> weights, Allocator alloc)
    : bins(weights.size(), alloc) {
    // Normalize _weights_ to compute alias table PDF
    Float sum = std::accumulate(weights.begin(), weights.end(), 0.);
    CHECK_GT(sum, 0);
    for (size_t i = 0; i < weights.size(); ++i)
        bins[i].pdf = weights[i] / sum;

    // Create alias table work lists
    struct Outcome {
        Float pHat;
        size_t index;
    };
    std::vector<Outcome> under, over;
    for (size_t i = 0; i < bins.size(); ++i) {
        // Add outcome _i_ to an alias table work list
        Float pHat = bins[i].pdf * bins.size();
        if (pHat < 1)
            under.push_back(Outcome{pHat, i});
        else
            over.push_back(Outcome{pHat, i});
    }

    // Process under and over work item together
    while (!under.empty() && !over.empty()) {
        // Remove an item from each alias table work list
        Outcome un = under.back(), ov = over.back();
        under.pop_back();
        over.pop_back();

        // Initialize probability and alias for _un_
        bins[un.index].q = un.pHat;
        bins[un.index].alias = ov.index;

        // Push excess probability on to work list
        Float pExcess = (un.pHat + ov.pHat) - 1;
        if (pExcess < 1)
            under.push_back(Outcome{pExcess, ov.index});
        else
            over.push_back(Outcome{pExcess, ov.index});
    }

    // Handle remaining alias table work items
    while (!over.empty()) {
        Outcome ov = over.back();
        over.pop_back();
        bins[ov.index].q = 1;
        bins[ov.index].alias = -1;
    }
    while (!under.empty()) {
        Outcome un = under.back();
        under.pop_back();
        bins[un.index].q = 1;
        bins[un.index].alias = -1;
    }
}